

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O0

uintptr_t upb_Message_GetTaggedMessagePtr
                    (upb_Message *msg,upb_MiniTableField *f,upb_Message *default_val)

{
  upb_Message *to;
  upb_MiniTableField *f_00;
  _Bool _Var1;
  upb_CType uVar2;
  upb_FieldRep uVar3;
  void *from;
  anon_union_8_2_9eb4e620_for_upb_Message_0 local_48;
  uintptr_t tagged;
  upb_Message *default_val_local;
  upb_MiniTableField *f_local;
  upb_Message *msg_local;
  uintptr_t *local_20;
  upb_MiniTableField *local_18;
  upb_MiniTableField *local_10;
  
  tagged = (uintptr_t)default_val;
  default_val_local = (upb_Message *)f;
  f_local = (upb_MiniTableField *)msg;
  uVar2 = upb_MiniTableField_CType(f);
  if (uVar2 != kUpb_CType_Message) {
    __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Message",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x1bd,
                  "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                 );
  }
  uVar3 = _upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only
                    ((upb_MiniTableField *)default_val_local);
  if (uVar3 != kUpb_FieldRep_8Byte) {
    __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_8Byte"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x1bf,
                  "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                 );
  }
  _Var1 = upb_MiniTableField_IsScalar((upb_MiniTableField *)default_val_local);
  if (!_Var1) {
    __assert_fail("upb_MiniTableField_IsScalar(f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x1c0,
                  "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                 );
  }
  local_10 = f_local;
  local_18 = (upb_MiniTableField *)default_val_local;
  local_20 = &tagged;
  msg_local = (upb_Message *)&local_48;
  _Var1 = upb_MiniTableField_IsExtension((upb_MiniTableField *)default_val_local);
  if (!_Var1) {
    _Var1 = upb_MiniTableField_IsInOneof(local_18);
    if (((_Var1) ||
        (_Var1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                           (local_18,local_20), !_Var1)) &&
       (_Var1 = upb_Message_HasBaseField((upb_Message *)local_10,local_18), !_Var1)) {
      _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(local_18,msg_local,local_20);
      return local_48.internal_opaque;
    }
    f_00 = local_18;
    to = msg_local;
    from = _upb_Message_DataPtr_dont_copy_me__upb_internal_use_only
                     ((upb_Message *)local_10,local_18);
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f_00,to,from);
    return local_48.internal_opaque;
  }
  __assert_fail("!upb_MiniTableField_IsExtension(field)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x10d,
                "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
               );
}

Assistant:

UPB_API_INLINE uintptr_t upb_Message_GetTaggedMessagePtr(
    const struct upb_Message* msg, const upb_MiniTableField* f,
    struct upb_Message* default_val) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Message);
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(f) ==
             UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte));
  UPB_ASSUME(upb_MiniTableField_IsScalar(f));
  uintptr_t tagged;
  _upb_Message_GetNonExtensionField(msg, f, &default_val, &tagged);
  return tagged;
}